

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::IfStatementGenerateCode<luna::ElseIfStatement>
          (CodeGenerateVisitor *this,ElseIfStatement *if_stmt)

{
  Function *this_00;
  SyntaxTree *pSVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Instruction *pIVar6;
  Guard g_1;
  ExpVarData_conflict exp_var_data;
  Guard g;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  uint local_78;
  int local_74;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  Guard local_50;
  
  this_00 = this->current_function_->function_;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:585:13)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:585:13)>
             ::_M_manager;
  local_98._12_4_ = 0;
  local_98._8_4_ = this->current_function_->register_id_;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:585:13)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:585:13)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  Guard::Guard(&local_50,(function<void_()> *)&local_b8,(function<void_()> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  uVar2 = GenerateRegisterId(this);
  local_74 = uVar2 + 1;
  pSVar1 = (if_stmt->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  local_78 = uVar2;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  sVar3 = Function::AddInstruction
                    (this_00,(Instruction)((uVar2 & 0xff) << 0x10 | 0xf000000),if_stmt->line_);
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:595:17)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:595:17)>
             ::_M_manager;
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:595:17)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:595:17)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  local_70._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_b8,(function<void_()> *)&local_98,(function<void_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  pSVar1 = (if_stmt->true_branch_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  Guard::~Guard((Guard *)&local_b8);
  sVar4 = Function::AddInstruction(this_00,(Instruction)0x12000000,if_stmt->block_end_line_);
  sVar5 = Function::OpCodeSize(this_00);
  pIVar6 = Function::GetMutableInstruction(this_00,(long)(int)sVar3);
  *(short *)&pIVar6->opcode_ = (short)sVar5 - (short)sVar3;
  Guard::~Guard(&local_50);
  pSVar1 = (if_stmt->false_branch_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  }
  sVar3 = Function::OpCodeSize(this_00);
  pIVar6 = Function::GetMutableInstruction(this_00,(long)(int)sVar4);
  *(short *)&pIVar6->opcode_ = (short)sVar3 - (short)sVar4;
  return;
}

Assistant:

void CodeGenerateVisitor::IfStatementGenerateCode(StatementType *if_stmt)
    {
        auto function = GetCurrentFunction();
        int jmp_end_index = 0;
        {
            REGISTER_GENERATOR_GUARD();
            auto register_id = GenerateRegisterId();
            ExpVarData exp_var_data{ register_id, register_id + 1 };
            if_stmt->exp_->Accept(this, &exp_var_data);

            auto instruction = Instruction::AsBxCode(OpType_JmpFalse, register_id, 0);
            int jmp_index = function->AddInstruction(instruction, if_stmt->line_);

            {
                // True branch block generate code
                CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
                if_stmt->true_branch_->Accept(this, nullptr);
            }

            // Jmp to the end of if-elseif-else statement after excute block
            instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
            jmp_end_index = function->AddInstruction(instruction, if_stmt->block_end_line_);

            // Refill OpType_JmpFalse instruction
            int index = function->OpCodeSize();
            function->GetMutableInstruction(jmp_index)->RefillsBx(index - jmp_index);
        }

        if (if_stmt->false_branch_)
            if_stmt->false_branch_->Accept(this, nullptr);

        // Refill OpType_Jmp instruction
        int end_index = function->OpCodeSize();
        function->GetMutableInstruction(jmp_end_index)->RefillsBx(end_index - jmp_end_index);
    }